

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

bool ON_EvaluateQuotientRule3(int dim,int der_count,int v_stride,double *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int i;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  double *pdVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  int i_00;
  long lVar28;
  uint uVar29;
  uint i_01;
  long lVar30;
  bool bVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  int local_dc;
  uint local_d0;
  int local_c0;
  int local_bc;
  int local_b8;
  
  dVar1 = v[dim];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    iVar13 = (der_count + 3) * (der_count + 2) * (der_count + 1) * v_stride;
    if (10 < iVar13 + 5U) {
      lVar20 = 0;
      do {
        v[lVar20] = v[lVar20] * (1.0 / dVar1);
        lVar20 = lVar20 + 1;
      } while (iVar13 / 6 != (int)lVar20);
    }
    if (der_count != 0) {
      lVar20 = (long)v_stride;
      dVar32 = v[lVar20 + dim];
      dVar35 = -dVar32;
      dVar33 = v[lVar20 + (v_stride + dim)];
      dVar36 = -dVar33;
      iVar13 = v_stride * 2;
      lVar25 = (long)(dim + v_stride * 2);
      dVar34 = v[lVar20 + lVar25];
      dVar37 = -dVar34;
      if (dim != 0) {
        lVar26 = 0;
        do {
          dVar2 = v[lVar26];
          v[lVar20 + lVar26] = dVar35 * dVar2 + v[lVar20 + lVar26];
          v[lVar20 * 2 + lVar26] = dVar36 * dVar2 + v[lVar20 * 2 + lVar26];
          v[lVar20 + iVar13 + lVar26] = dVar2 * dVar37 + v[lVar20 + iVar13 + lVar26];
          lVar26 = lVar26 + 1;
        } while (dim != (int)lVar26);
      }
      if (1 < der_count) {
        if (dim != 0) {
          lVar26 = (long)(v_stride * 4);
          dVar2 = v[lVar26 + dim];
          dVar3 = v[lVar26 + (v_stride + dim)];
          dVar4 = v[lVar26 + lVar25];
          dVar5 = v[lVar26 + (v_stride * 3 + dim)];
          dVar6 = v[lVar26 + (dim + v_stride * 4)];
          iVar19 = v_stride * 5;
          dVar7 = v[lVar26 + (iVar19 + dim)];
          lVar25 = (long)iVar13;
          lVar28 = (long)(v_stride * 3);
          lVar30 = 0;
          do {
            dVar8 = v[lVar20 + lVar30];
            dVar9 = v[lVar25 + lVar30];
            dVar10 = v[lVar28 + lVar30];
            dVar11 = v[lVar30];
            v[lVar26 + lVar30] = -dVar2 * dVar11 + dVar32 * -2.0 * dVar8 + v[lVar26 + lVar30];
            v[lVar20 + lVar26 + lVar30] =
                 dVar36 * dVar8 + -dVar3 * dVar11 + dVar9 * dVar35 + v[lVar20 + lVar26 + lVar30];
            v[lVar26 + lVar25 + lVar30] =
                 dVar8 * dVar37 + -dVar4 * dVar11 + dVar10 * dVar35 + v[lVar26 + lVar25 + lVar30];
            v[lVar26 + lVar28 + lVar30] =
                 -dVar5 * dVar11 + dVar33 * -2.0 * dVar9 + v[lVar26 + lVar28 + lVar30];
            v[lVar26 * 2 + lVar30] =
                 dVar9 * dVar37 + -dVar6 * dVar11 + dVar10 * dVar36 + v[lVar26 * 2 + lVar30];
            v[(long)iVar19 + lVar26 + lVar30] =
                 dVar11 * -dVar7 + dVar34 * -2.0 * dVar10 + v[(long)iVar19 + lVar26 + lVar30];
            lVar30 = lVar30 + 1;
          } while (dim != (int)lVar30);
        }
        if (der_count != 2) {
          iVar13 = 3;
          if (der_count < 4) {
            der_count = 3;
          }
          pdVar22 = v + v_stride * 10;
          iVar19 = 4;
          uVar12 = 6;
          do {
            iVar17 = 1;
            local_d0 = 2;
            iVar24 = iVar13;
            local_c0 = iVar19;
            do {
              local_bc = 0;
              uVar16 = 1;
              local_dc = iVar13 - iVar24;
              local_b8 = iVar17;
              do {
                if (-1 < iVar24) {
                  uVar14 = (iVar13 - iVar24) - local_dc;
                  i_00 = 0;
                  do {
                    if (-1 < local_dc) {
                      dVar32 = ON_BinomialCoefficient(i_00,iVar24 - i_00);
                      i = 0;
                      do {
                        bVar31 = i == 0 && i_00 == 0;
                        i_01 = (uint)bVar31;
                        uVar29 = (uint)bVar31;
                        if (uVar29 <= uVar14) {
                          dVar33 = ON_BinomialCoefficient(i,local_dc - i);
                          iVar27 = i + i_00;
                          iVar23 = local_bc - uVar29;
                          do {
                            dVar34 = ON_BinomialCoefficient(i_01,uVar14 - i_01);
                            if (0 < dim) {
                              iVar18 = iVar27 + i_01;
                              iVar15 = iVar13 - iVar18;
                              dVar35 = v[(int)(((((iVar18 - i_00) + 1) * (iVar18 - i_00)) / 2 + i_01
                                               + ((iVar27 + i_01 + 2) * (iVar27 + i_01 + 1) * iVar18
                                                 ) / 6) * v_stride + dim)];
                              uVar21 = 0;
                              do {
                                pdVar22[uVar21] =
                                     v[(long)(((((iVar15 - iVar24) + i_00 + 1) *
                                               ((iVar15 - iVar24) + i_00)) / 2 + iVar23 +
                                              ((iVar15 + 2) * (iVar15 + 1) * iVar15) / 6) * v_stride
                                             ) + uVar21] * dVar34 * dVar33 * -dVar32 * dVar35 +
                                     pdVar22[uVar21];
                                uVar21 = uVar21 + 1;
                              } while ((uint)dim != uVar21);
                            }
                            i_01 = i_01 + 1;
                            iVar23 = iVar23 + -1;
                          } while (i_01 != uVar16);
                        }
                        i = i + 1;
                      } while (i != local_b8);
                    }
                    i_00 = i_00 + 1;
                  } while (i_00 != local_c0);
                }
                pdVar22 = pdVar22 + lVar20;
                local_dc = local_dc + -1;
                uVar16 = uVar16 + 1;
                local_b8 = local_b8 + -1;
                local_bc = local_bc + 1;
              } while (uVar16 != local_d0);
              iVar24 = iVar24 + -1;
              iVar17 = iVar17 + 1;
              local_c0 = local_c0 + -1;
              local_d0 = local_d0 + 1;
            } while (local_d0 != uVar12);
            iVar13 = iVar13 + 1;
            iVar19 = iVar19 + 1;
            bVar31 = uVar12 != der_count + 3U;
            uVar12 = uVar12 + 1;
          } while (bVar31);
        }
      }
    }
  }
  return (bool)(-(dVar1 != 0.0) & 1);
}

Assistant:

bool ON_EvaluateQuotientRule3( int dim, int der_count, int v_stride, double *v )
{
  double
    F, Fr, Fs, Ft, wr, ws, wt, wrr, wrs, wrt, wss, wst, wtt, *f, *x;
  int
    i, j, k, n;

  // comment notation:
  //   X = value of numerator
  //   W = value of denominator
  //   F = X/W
  //   Xr = partial w.r.t. 1st parameter
  //   Xs = partial w.r.t. 2nd parameter
  //   Xt = partial w.r.t. 3rd parameter 
  //   ...

	// divide everything by the weight
  F = v[dim];
  if (F == 0.0)
    return false;
  F = 1.0/F;
  n = der_count+1;
  i = v_stride*n*(n+1)*(n+2)/6;
  x = v;
  while(i--) 
    *x++ *= F;

  if (der_count) 
  {
		// first derivatives
    f = v;                   // f = F
    x = v + v_stride;        // x = Xr/w, x[v_stride] = Xs/w
    wr = -x[dim];            // wr = -Wr/w
    ws = -x[dim+v_stride];   // ws = -Ws/w
    wt = -x[dim+2*v_stride]; // wt = -Wt/w
    j = dim; 
		while (j--) 
    {
			F = *f++;
			x[0]          += wr*F;
			x[v_stride]   += ws*F;
			x[2*v_stride] += wt*F;
			x++;
		}

    if (der_count> 1) 
    {
      // 2nd derivatives
      f = v;                // f = F, f[v_stride] = Fr, f[2*v_stride] = Fs, f[3*v_stride] = Ft
      x = v + 4*v_stride;   // x = Xrr, x[v_strde] = Xrs, ...
      wrr = -x[dim];
			wrs = -x[dim+v_stride];
			wrt = -x[dim+2*v_stride];
			wss = -x[dim+3*v_stride];
			wst = -x[dim+4*v_stride];
			wtt = -x[dim+5*v_stride];
      j = dim; 
			while(j--) 
      {
				Fr = f[v_stride];
				Fs = f[2*v_stride];
				Ft = f[3*v_stride];
				F = *f++;
				x[0]          += wrr*F + 2.0*wr*Fr;     // Drr
				x[v_stride]   += wrs*F + wr*Fs + ws*Fr; // Drs
				x[2*v_stride] += wrt*F + wr*Ft + wt*Fr; // Drt
				x[3*v_stride] += wss*F + 2.0*ws*Fs;     // Dss
				x[4*v_stride] += wst*F + ws*Ft + wt*Fs; // Dst
				x[5*v_stride] += wtt*F + 2.0*wt*Ft;     // Dtt
				x++;
			}

      if ( der_count > 2 )
      {
        int ii, jj, kk, Fn, q;
        f = v + 10*v_stride; // f = Xrrr
        for ( n = 3; n <= der_count; n++ ) 
        {
          for ( i = n; i >= 0; i-- ) 
          {
            for ( j = n-i; j >= 0; j-- )
            {
              k = n-i-j;
              // f = Dr^i Ds^j Dt^k
              for ( ii = 0; ii <= i; ii++ ) 
              {
                wr = ON_BinomialCoefficient(ii,i-ii);
                for ( jj = 0; jj <= j; jj++ ) 
                {
                  ws = wr*ON_BinomialCoefficient(jj,j-jj);
                  for ( kk = (ii||jj)?0:1; kk <= k; kk++ ) 
                  {
                    q = ii+jj+kk;
                    Fn=q-ii;
                    Fn = v_stride*( q*(q+1)*(q+2)/6  +  Fn*(Fn+1)/2  +  kk )+dim;
                    // wt = -(i choose ii)*(j choose jj)*(k choose kk)*W(ii,jj,kk)
                    wt = -ws*ON_BinomialCoefficient(kk,k-kk)*v[Fn];
                    q = n-q;
                    Fn = q-i+ii;
                    // F(i-ii,j-jj,k-kk) = v[Fn]
                    Fn = v_stride*( q*(q+1)*(q+2)/6  +  Fn*(Fn+1)/2  +  k-kk );
                    for ( q = 0; q < dim; q++ )
                      f[q] += wt*v[Fn+q];
                  }
                }
              }
              f += v_stride;
            }
          }
        }
      }
    }
  }

  return true;
}